

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O2

void __thiscall TxRequestTracker::Impl::ForgetTxHash(Impl *this,uint256 *txhash)

{
  bool bVar1;
  Iter<(anonymous_namespace)::ByTxHash> it;
  long in_FS_OFFSET;
  tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
  super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
  super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<2UL,_unsigned_long,_false>)0;
  local_38.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
  super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
  super__Head_base<1UL,_(anonymous_namespace)::State,_false>._M_head_impl = CANDIDATE_DELAYED;
  local_38.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
  super__Head_base<0UL,_const_uint256_&,_false>._M_head_impl = txhash;
  for (it.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                  *)boost::multi_index::detail::
                    ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,std::less<std::tuple<uint256_const&,(anonymous_namespace)::State,unsigned_long>>,boost::multi_index::detail::nth_layer<2,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByTxHash,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                    ::
                    lower_bound<std::tuple<uint256_const&,(anonymous_namespace)::State,unsigned_long>>
                              ((ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,std::less<std::tuple<uint256_const&,(anonymous_namespace)::State,unsigned_long>>,boost::multi_index::detail::nth_layer<2,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByTxHash,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                                *)&(this->m_index).super_type,&local_38);
      (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
       *)it.node !=
      (this->m_index).
      super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
      .member; it = Erase<(anonymous_namespace)::ByTxHash>(this,it)) {
    bVar1 = ::operator==((base_blob<256U> *)it.node,&txhash->super_base_blob<256U>);
    if (!bVar1) break;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ForgetTxHash(const uint256& txhash)
    {
        auto it = m_index.get<ByTxHash>().lower_bound(ByTxHashView{txhash, State::CANDIDATE_DELAYED, 0});
        while (it != m_index.get<ByTxHash>().end() && it->m_txhash == txhash) {
            it = Erase<ByTxHash>(it);
        }
    }